

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

stbtt__buf stbtt__cff_get_index(stbtt__buf *b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  stbtt__buf sVar10;
  stbtt__buf sVar11;
  
  uVar1 = b->cursor;
  uVar2 = b->size;
  uVar3 = 0;
  iVar5 = 2;
  uVar7 = uVar1;
  do {
    if ((int)uVar7 < (int)uVar2) {
      lVar9 = (long)(int)uVar7;
      uVar7 = uVar7 + 1;
      b->cursor = uVar7;
      uVar6 = (uint)b->data[lVar9];
    }
    else {
      uVar6 = 0;
    }
    uVar3 = uVar3 << 8 | uVar6;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  if (uVar3 != 0) {
    uVar6 = 0;
    if ((int)uVar7 < (int)uVar2) {
      lVar9 = (long)(int)uVar7;
      uVar7 = uVar7 + 1;
      b->cursor = uVar7;
      uVar6 = (uint)b->data[lVar9];
    }
    uVar7 = uVar3 * uVar6 + uVar7;
    uVar3 = uVar7;
    if ((int)uVar2 < (int)uVar7) {
      uVar3 = uVar2;
    }
    if ((int)uVar7 < 0) {
      uVar3 = uVar2;
    }
    if (uVar6 == 0) {
      iVar5 = -1;
    }
    else {
      uVar7 = 0;
      do {
        if ((int)uVar3 < (int)uVar2) {
          lVar9 = (long)(int)uVar3;
          uVar3 = uVar3 + 1;
          b->cursor = uVar3;
          uVar8 = (uint)b->data[lVar9];
        }
        else {
          uVar8 = 0;
        }
        uVar7 = uVar7 << 8 | uVar8;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      iVar5 = uVar7 - 1;
    }
    uVar3 = uVar3 + iVar5;
    uVar7 = uVar3;
    if ((int)uVar2 < (int)uVar3) {
      uVar7 = uVar2;
    }
    if ((int)uVar3 < 0) {
      uVar7 = uVar2;
    }
    b->cursor = uVar7;
  }
  if ((-1 < (int)(uVar7 - uVar1 | uVar1)) && (puVar4 = (uchar *)0x0, (int)uVar1 <= (int)uVar2)) {
    lVar9 = 0;
    if ((int)uVar7 <= (int)uVar2) {
      puVar4 = b->data + uVar1;
      lVar9 = (ulong)(uVar7 - uVar1) << 0x20;
    }
    sVar10.cursor = (int)lVar9;
    sVar10.size = (int)((ulong)lVar9 >> 0x20);
    sVar10.data = puVar4;
    return sVar10;
  }
  sVar11.size = 0;
  sVar11.data = (uchar *)0x0;
  sVar11.cursor = 0;
  return sVar11;
}

Assistant:

static stbtt__buf stbtt__cff_get_index(stbtt__buf *b)
{
   int count, start, offsize;
   start = b->cursor;
   count = stbtt__buf_get16(b);
   if (count) {
      offsize = stbtt__buf_get8(b);
      STBTT_assert(offsize >= 1 && offsize <= 4);
      stbtt__buf_skip(b, offsize * count);
      stbtt__buf_skip(b, stbtt__buf_get(b, offsize) - 1);
   }
   return stbtt__buf_range(b, start, b->cursor - start);
}